

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::blockConnected(CWallet *this,ChainstateRole role,BlockInfo *block)

{
  uint256 *puVar1;
  pointer psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  size_t index;
  ulong uVar7;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  _Variadic_union<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
  local_68;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (role != BACKGROUND) {
    if (block->data == (CBlock *)0x0) {
      __assert_fail("block.data",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x5e7,
                    "virtual void wallet::CWallet::blockConnected(ChainstateRole, const interfaces::BlockInfo &)"
                   );
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock28,&this->cs_wallet,"cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x5e8,false);
    this->m_last_block_processed_height = block->height;
    puVar1 = block->hash;
    uVar3 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    uVar4 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    uVar5 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
         uVar5;
    *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems = uVar3;
    *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
         uVar4;
    if ((this->m_birth_time).super___atomic_base<long>._M_i + -0x3840 <=
        (long)(ulong)block->chain_time_max) {
      lVar6 = 0;
      for (uVar7 = 0;
          psVar2 = (block->data->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(block->data->vtx).
                                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
          uVar7 = uVar7 + 1) {
        puVar1 = block->hash;
        local_68._M_first._M_storage.confirmed_block_height = block->height;
        local_68._0_8_ = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
        local_68._8_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
        local_68._16_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
        local_68._24_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
        local_68._M_first._M_storage.position_in_block = (int)uVar7;
        local_40 = 0;
        SyncTransaction(this,(CTransactionRef *)
                             ((long)&(psVar2->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar6),(SyncTxState *)&local_68._M_first,true,false)
        ;
        transactionRemovedFromMempool
                  (this,(CTransactionRef *)
                        ((long)&(((block->data->vtx).
                                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + lVar6),BLOCK);
        lVar6 = lVar6 + 0x10;
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::blockConnected(ChainstateRole role, const interfaces::BlockInfo& block)
{
    if (role == ChainstateRole::BACKGROUND) {
        return;
    }
    assert(block.data);
    LOCK(cs_wallet);

    m_last_block_processed_height = block.height;
    m_last_block_processed = block.hash;

    // No need to scan block if it was created before the wallet birthday.
    // Uses chain max time and twice the grace period to adjust time for block time variability.
    if (block.chain_time_max < m_birth_time.load() - (TIMESTAMP_WINDOW * 2)) return;

    // Scan block
    for (size_t index = 0; index < block.data->vtx.size(); index++) {
        SyncTransaction(block.data->vtx[index], TxStateConfirmed{block.hash, block.height, static_cast<int>(index)});
        transactionRemovedFromMempool(block.data->vtx[index], MemPoolRemovalReason::BLOCK);
    }
}